

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::iterate
          (ShaderBuiltinConstantCase<int> *this)

{
  GetConstantValueFunc p_Var1;
  TestLog *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  ShaderExecutor *pSVar4;
  TestError *this_00;
  ShaderType shaderType;
  int result;
  ScopedLogSection section;
  char *shaderTypeName;
  void *outputs;
  int local_36c [4];
  int local_35c;
  string *local_358;
  ScopedLogSection local_350;
  char *local_348;
  int *local_340;
  string *local_338;
  undefined1 local_330 [8];
  undefined1 local_328 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  qpKeyValueTag local_2d0;
  deInt64 local_2c8;
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  p_Var1 = this->m_getValue;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_35c = (*p_Var1)((Functions *)CONCAT44(extraout_var,iVar3));
  shaderType = SHADERTYPE_VERTEX;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_358 = &this->m_varName;
  local_338 = &this->m_requiredExt;
  do {
    local_348 = glu::getShaderTypeName(shaderType);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_330,local_348,(allocator<char> *)&local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,local_348,(allocator<char> *)local_36c);
    tcu::ScopedLogSection::ScopedLogSection
              (&local_350,pTVar2,(string *)local_330,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,
                      CONCAT71(local_1a0[0].m_log._1_7_,local_1a0[0].m_log._0_1_) + 1);
    }
    if (local_330 != (undefined1  [8])(local_328 + 8)) {
      operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
    }
    pSVar4 = createGetConstantExecutor
                       (((this->super_TestCase).m_context)->m_renderCtx,shaderType,TYPE_INT,
                        local_358,local_338);
    local_36c[0] = -1;
    local_340 = local_36c;
    iVar3 = (*pSVar4->_vptr_ShaderExecutor[2])(pSVar4);
    if ((char)iVar3 == '\0') {
      (*pSVar4->_vptr_ShaderExecutor[3])
                (pSVar4,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                 ,0xe8);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*pSVar4->_vptr_ShaderExecutor[5])(pSVar4);
    (*pSVar4->_vptr_ShaderExecutor[6])(pSVar4,1,0,&local_340);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_1b0 = (undefined1  [8])local_1a0;
    local_1a8 = (_func_int **)0x0;
    local_1a0[0].m_log._0_1_ = 0;
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_330,local_358,local_358,(string *)local_1b0,QP_KEY_TAG_NONE,
               (long)local_36c[0]);
    tcu::TestLog::writeInteger
              (pTVar2,(char *)local_330,local_310._M_p,local_2f0._M_p,local_2d0,local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_p != &local_2e0) {
      operator_delete(local_2f0._M_p,local_2e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_p != &local_300) {
      operator_delete(local_310._M_p,local_300._M_allocated_capacity + 1);
    }
    if (local_330 != (undefined1  [8])(local_328 + 8)) {
      operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
    }
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,
                      CONCAT71(local_1a0[0].m_log._1_7_,local_1a0[0].m_log._0_1_) + 1);
    }
    if (local_36c[0] != local_35c) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ERROR: Expected ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(this->m_varName)._M_dataplus._M_p,
                 (this->m_varName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," = ",3);
      std::ostream::operator<<((ostringstream *)&local_1a8,local_35c);
      local_330 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"Test shader:",0xc);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      (*pSVar4->_vptr_ShaderExecutor[3])
                (pSVar4,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid builtin constant value");
    }
    (*pSVar4->_vptr_ShaderExecutor[1])(pSVar4);
    tcu::TestLog::endSection(local_350.m_log);
    shaderType = shaderType + SHADERTYPE_FRAGMENT;
  } while (shaderType != SHADERTYPE_LAST);
  return STOP;
}

Assistant:

TestCase::IterateResult ShaderBuiltinConstantCase<DataType>::iterate (void)
{
	const DataType	reference	= m_getValue(m_context.getRenderContext().getFunctions());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
	{
		if ((SHADER_TYPES & (1<<shaderType)) != 0)
		{
			const char* const			shaderTypeName	= glu::getShaderTypeName(glu::ShaderType(shaderType));
			const tcu::ScopedLogSection	section			(m_testCtx.getLog(), shaderTypeName, shaderTypeName);

			try
			{
				const bool isOk = verifyInShaderType(glu::ShaderType(shaderType), reference);
				DE_ASSERT(isOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);
				DE_UNREF(isOk);
			}
			catch (const tcu::NotSupportedError& e)
			{
				m_testCtx.getLog() << TestLog::Message << "Not checking " << shaderTypeName << ": " << e.what() << TestLog::EndMessage;
			}
			catch (const tcu::TestError& e)
			{
				m_testCtx.getLog() << TestLog::Message << e.what() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
			}
		}
	}

	return STOP;
}